

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::UniformBlockTypes::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nuniform SimpleBlock {                \n   mat3x2 a;                         \n   mat4 b;                           \n   vec4 c;                           \n};                                   \nuniform NotSoSimpleBlockk {          \n   ivec2 a[4];                       \n   mat3 b[2];                        \n   mat2 c;                           \n} d;                                 \nvoid main(void)                      \n{                                    \n    float tmp;                       \n    tmp =  a[0][1] * b[1][2] * c.x;  \n    tmp = tmp + d.a[2].y + d.b[0][1][1] + d.c[1][1];             \n    gl_Position = position * tmp;    \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   ""
			   "uniform SimpleBlock {                \n"
			   "   mat3x2 a;                         \n"
			   "   mat4 b;                           \n"
			   "   vec4 c;                           \n"
			   "};                                   \n"
			   ""
			   "uniform NotSoSimpleBlockk {          \n"
			   "   ivec2 a[4];                       \n"
			   "   mat3 b[2];                        \n"
			   "   mat2 c;                           \n"
			   "} d;                                 \n"
			   ""
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    float tmp;                       \n"
			   "    tmp =  a[0][1] * b[1][2] * c.x;  \n"
			   "    tmp = tmp + d.a[2].y + d.b[0][1][1] + d.c[1][1];             \n"
			   "    gl_Position = position * tmp;    \n"
			   "}";
	}